

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O2

void __thiscall TargetImageWidget::paintEvent(TargetImageWidget *this,QPaintEvent *param_1)

{
  QPainter p;
  QPen targetAreaPen;
  QRectF local_30;
  
  QPainter::QPainter(&p,(QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QBrush::QBrush((QBrush *)&local_30,white,SolidPattern);
  QPainter::setBackground((QBrush *)&p);
  QBrush::~QBrush((QBrush *)&local_30);
  PaintImage(this,&p);
  QPainter::setCompositionMode((CompositionMode)&p);
  QColor::QColor((QColor *)&local_30,white);
  QPen::QPen(&targetAreaPen,(QColor *)&local_30);
  QPen::setWidthF(5.0);
  QPen::setStyle((PenStyle)&targetAreaPen);
  QPainter::setPen((QPen *)&p);
  GetTargetRect(this);
  QPainter::drawRect(&p,&local_30);
  QPen::~QPen(&targetAreaPen);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void TargetImageWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);
    p.setBackground(QBrush(Qt::white));

    PaintImage(p);

    // Draw bounds that need filling
    p.setCompositionMode(QPainter::CompositionMode_Difference);

    QPen targetAreaPen(Qt::white);
    targetAreaPen.setWidthF(qreal{ 5.0 });
    targetAreaPen.setStyle(Qt::PenStyle::DashLine);
    p.setPen(targetAreaPen);

    p.drawRect(GetTargetRect());
}